

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O3

sexp_conflict
sexp_close_file_descriptor_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  int iVar1;
  sexp_conflict psVar2;
  
  if (((ulong)arg0 & 3) == 0) {
    if (arg0->tag != 0x12) goto LAB_00103d50;
    iVar1 = (int)(arg0->value).fileno.fd;
  }
  else {
    if (((ulong)arg0 & 1) == 0) {
LAB_00103d50:
      psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,0x12);
      return psVar2;
    }
    iVar1 = (int)((long)arg0 >> 1);
  }
  iVar1 = close(iVar1);
  return (sexp_conflict)((ulong)(iVar1 == 0) << 8 | 0x3e);
}

Assistant:

sexp sexp_close_file_descriptor_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  int err = 0;
  sexp res;
  if (! (sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_type_exception(ctx, self, SEXP_FILENO, arg0);
  err = close((sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}